

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Position * __thiscall pfederc::Lexer::getCurrentCursor(Position *__return_storage_ptr__,Lexer *this)

{
  size_type sVar1;
  size_t local_48;
  Lexer *this_local;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->lineIndices);
  if (this->currentEndIndex == 0) {
    local_48 = 0;
  }
  else {
    local_48 = this->currentEndIndex - 1;
  }
  Position::Position(__return_storage_ptr__,sVar1 - 1,this->currentStartIndex,local_48);
  return __return_storage_ptr__;
}

Assistant:

Position Lexer::getCurrentCursor() const noexcept {
  return Position(lineIndices.size() - 1, currentStartIndex,
    currentEndIndex > 0 ? currentEndIndex - 1 : 0);
}